

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MySharedMemory.cpp
# Opt level: O0

bool __thiscall MySharedMemory::attach(MySharedMemory *this,size_t size)

{
  int __fd;
  char *pcVar1;
  void *pvVar2;
  sem_t *psVar3;
  int fd;
  size_t size_local;
  MySharedMemory *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __fd = shm_open(pcVar1,2,0x1b6);
  if (__fd == -1) {
    std::__cxx11::string::operator=
              ((string *)&this->error_message,"Error while opening shared memory object\n");
    this_local._7_1_ = false;
  }
  else {
    pvVar2 = mmap((void *)0x0,size,3,1,__fd,0);
    this->addr = pvVar2;
    if (this->addr == (void *)0xffffffffffffffff) {
      std::__cxx11::string::operator=((string *)&this->error_message,"Error wile mapping a file\n");
      this_local._7_1_ = false;
    }
    else {
      this->mapping_size = size;
      std::operator<<((ostream *)&std::cout,"Hello\n");
      pcVar1 = (char *)std::__cxx11::string::c_str();
      psVar3 = sem_open(pcVar1,2);
      this->sem = (sem_t *)psVar3;
      if (this->sem == (sem_t *)0x0) {
        std::__cxx11::string::operator=
                  ((string *)&this->error_message,"Error while opening a semaphor\n");
        this_local._7_1_ = false;
      }
      else {
        close(__fd);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool MySharedMemory::attach(size_t size) {
    #ifdef _WIN32
    this->mapping_size = size;
    memoryHandle = OpenFileMapping(
            FILE_MAP_ALL_ACCESS,   // read/write access
            FALSE,                 // do not inherit the name
            key.c_str());
    if (memoryHandle == NULL)
    {
        error_message =  "Could not attach to file mapping object";
        return false;
    }
    addr = MapViewOfFile(memoryHandle, // handle to map object
                        FILE_MAP_ALL_ACCESS,  // read/write permission
                        0,
                        0,
                        this->mapping_size);
    if (addr == NULL)
    {
        error_message =  "Could not map view";
        return false;
    }

    semaphoreHandle = OpenSemaphore(
            SEMAPHORE_MODIFY_STATE | SYNCHRONIZE,
            FALSE,
            (key + "SEM").c_str());

    return true;
    #elif __linux__ || __APPLE__
    int fd = shm_open(key.c_str(), O_RDWR, 0666);
    if (fd == -1) {
        error_message = "Error while opening shared memory object\n";
        return false;
    }

    addr = mmap(nullptr, size, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    if (addr == MAP_FAILED) {
        error_message = "Error wile mapping a file\n";
        return false;
    }
    mapping_size = size;

    std::cout << "Hello\n";

    sem = sem_open(key.c_str(), O_RDWR);
    if (sem == SEM_FAILED) {
        error_message = "Error while opening a semaphor\n";
        return false;
    }

    close(fd);
    return true;
    #endif
}